

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_radix_tree.hpp
# Opt level: O0

parse_result * __thiscall cinatra::radix_tree::get(radix_tree *this,string *path,string *method)

{
  bool bVar1;
  __type_conflict4 _Var2;
  size_type sVar3;
  reference pvVar4;
  element_type *peVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  parse_result *in_RDI;
  int p;
  int n;
  int i;
  shared_ptr<cinatra::radix_tree_node> root;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  undefined7 in_stack_fffffffffffffe78;
  byte in_stack_fffffffffffffe7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  byte in_stack_fffffffffffffe97;
  element_type *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  int local_6c;
  __shared_ptr local_68 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDX;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x2768be);
  std::shared_ptr<cinatra::radix_tree_node>::shared_ptr
            ((shared_ptr<cinatra::radix_tree_node> *)in_stack_fffffffffffffe80,
             (shared_ptr<cinatra::radix_tree_node> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  local_6c = 0;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (local_18);
LAB_002768ef:
  do {
    if ((int)sVar3 <= local_6c) {
LAB_00276cf0:
      std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x276d05);
      radix_tree_node::get_handler
                (in_stack_fffffffffffffe98,
                 (string *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      std::
      tuple<bool,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::
      tuple<bool,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_true,_true>
                ((tuple<bool,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (bool *)in_stack_fffffffffffffe88,
                 (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                 in_stack_fffffffffffffe80,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::~function
                ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                 0x276d47);
LAB_00276d74:
      std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                ((shared_ptr<cinatra::radix_tree_node> *)0x276d81);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)0x276d8e);
      return in_RDI;
    }
    std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x276910);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27691f
                      );
    if (bVar1) {
      std::
      tuple<bool,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::tuple<void,_true>((tuple<bool,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)0x27692f);
      goto LAB_00276d74;
    }
    std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x27694c);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffe80,
                        CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    if (*pvVar4 == ':') {
      peVar5 = std::
               __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x27697d);
      std::
      vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
      ::operator[](&peVar5->children,0);
      std::shared_ptr<cinatra::radix_tree_node>::operator=
                ((shared_ptr<cinatra::radix_tree_node> *)in_stack_fffffffffffffe80,
                 (shared_ptr<cinatra::radix_tree_node> *)
                 CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      local_6c = find_pos((radix_tree *)
                          CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe88,(char)((ulong)in_stack_fffffffffffffe80 >> 0x38)
                          ,(int)in_stack_fffffffffffffe80);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&in_stack_fffffffffffffe98->path,
                 CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (size_type)in_stack_fffffffffffffe88);
      std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x276a06);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffe80,
                   (key_type *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffee0,in_RSI);
      std::__cxx11::string::~string(in_stack_fffffffffffffe80);
      goto LAB_002768ef;
    }
    std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x276a9b);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffe80,
                        CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    if (*pvVar4 == '*') {
      peVar5 = std::
               __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x276acc);
      std::
      vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
      ::operator[](&peVar5->children,0);
      std::shared_ptr<cinatra::radix_tree_node>::operator=
                ((shared_ptr<cinatra::radix_tree_node> *)in_stack_fffffffffffffe80,
                 (shared_ptr<cinatra::radix_tree_node> *)
                 CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&in_stack_fffffffffffffe98->path,
                 CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (size_type)in_stack_fffffffffffffe88);
      std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x276b1f);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffe80,
                   (key_type *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffee0,in_RSI);
      std::__cxx11::string::~string(in_stack_fffffffffffffe80);
      goto LAB_00276cf0;
    }
    in_stack_fffffffffffffe98 =
         std::
         __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x276b8d);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              (in_stack_fffffffffffffe80,
               CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    radix_tree_node::get_child(in_stack_fffffffffffffe98,in_stack_fffffffffffffe97);
    std::shared_ptr<cinatra::radix_tree_node>::operator=
              ((shared_ptr<cinatra::radix_tree_node> *)in_stack_fffffffffffffe80,
               (shared_ptr<cinatra::radix_tree_node> *)
               CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
              ((shared_ptr<cinatra::radix_tree_node> *)0x276be0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_68);
    in_stack_fffffffffffffe7f = 1;
    in_stack_fffffffffffffe97 = in_stack_fffffffffffffe7f;
    if (bVar1) {
      in_stack_fffffffffffffe88 = (string *)(long)local_6c;
      in_stack_fffffffffffffe80 = local_18;
      peVar5 = std::
               __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x276c2b);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (&peVar5->path);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&in_stack_fffffffffffffe98->path,
                 CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe90),
                 (size_type)in_stack_fffffffffffffe88);
      std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x276c64);
      _Var2 = std::operator==(in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->path);
      in_stack_fffffffffffffe7f = _Var2 ^ 0xff;
      in_stack_fffffffffffffe97 = in_stack_fffffffffffffe7f;
      std::__cxx11::string::~string(in_stack_fffffffffffffe80);
    }
    if ((in_stack_fffffffffffffe7f & 1) != 0) {
      std::
      tuple<bool,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::tuple<void,_true>((tuple<bool,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)0x276caf);
      goto LAB_00276d74;
    }
    peVar5 = std::
             __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x276ccc);
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&peVar5->path);
    local_6c = local_6c + (int)sVar6;
  } while( true );
}

Assistant:

parse_result get(const std::string &path, const std::string &method) {
    std::unordered_map<std::string, std::string> params;
    auto root = this->root;

    int i = 0, n = path.size(), p;

    while (i < n) {
      if (root->indices.empty())
        return parse_result();

      if (root->indices[0] == type_colon) {
        root = root->children[0];

        p = find_pos(path, type_slash, i);
        params[root->path] = path.substr(i, p - i);
        i = p;
      }
      else if (root->indices[0] == type_asterisk) {
        root = root->children[0];
        params[root->path] = path.substr(i);
        break;
      }
      else {
        root = root->get_child(path[i]);
        if (!root || path.substr(i, root->path.size()) != root->path)
          return parse_result();
        i += root->path.size();
      }
    }

    return parse_result{true, root->get_handler(method), params};
  }